

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

void __thiscall common_log::resume(common_log *this)

{
  int iVar1;
  thread local_20;
  anon_class_8_1_8991fb9c_for__M_head_impl local_18;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (this->running == false) {
    this->running = true;
    local_18.this = this;
    std::thread::thread<common_log::resume()::_lambda()_1_,,void>(&local_20,&local_18);
    if ((this->thrd)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->thrd)._M_id._M_thread = (native_handle_type)local_20._M_id._M_thread;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void resume() {
        std::lock_guard<std::mutex> lock(mtx);

        if (running) {
            return;
        }

        running = true;

        thrd = std::thread([this]() {
            while (true) {
                {
                    std::unique_lock<std::mutex> lock(mtx);
                    cv.wait(lock, [this]() { return head != tail; });

                    cur = entries[head];

                    head = (head + 1) % entries.size();
                }

                if (cur.is_end) {
                    break;
                }

                cur.print(); // stdout and stderr

                if (file) {
                    cur.print(file);
                }
            }
        });
    }